

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::AllocDecommitPages<BVStatic<272ul>,false>
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,uint pageCount,
          BVStatic<272UL> freePages,BVStatic<272UL> decommitPages)

{
  PageBitVector *this_00;
  PageBitVector *this_01;
  SecondaryAllocator *pSVar1;
  PageAllocatorBaseCommon *pPVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  BVIndex BVar6;
  uint uVar7;
  int iVar8;
  BVIndex BVar9;
  uint uVar10;
  undefined4 *puVar11;
  ulong uVar12;
  char *pcVar13;
  AllocatorType *pAVar14;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_02;
  char *lpAddress;
  undefined1 auStack_98 [8];
  BVStatic<272UL> freeAndDecommitPages;
  uintptr_t mask;
  
  BVar9 = this->freePageCount;
  this_00 = &this->freePages;
  BVar6 = BVStatic<272UL>::Count(this_00);
  if (BVar9 != BVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x192,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar4) goto LAB_00678cd9;
    *puVar11 = 0;
  }
  BVar9 = this->decommitPageCount;
  this_01 = &this->decommitPages;
  BVar6 = BVStatic<272UL>::Count(this_01);
  if (BVar9 != BVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x193,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar4) goto LAB_00678cd9;
    *puVar11 = 0;
  }
  uVar7 = this->decommitPageCount;
  if (uVar7 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x194,"(decommitPageCount != 0)","decommitPageCount != 0");
    if (!bVar4) goto LAB_00678cd9;
    *puVar11 = 0;
    uVar7 = this->decommitPageCount;
  }
  if (pageCount <= uVar7 + this->freePageCount) {
    pSVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).secondaryAllocator;
    if ((pSVar1 != (SecondaryAllocator *)0x0) &&
       (iVar8 = (*pSVar1->_vptr_SecondaryAllocator[3])(), (char)iVar8 == '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x199,
                         "(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate())"
                         ,
                         "this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate()"
                        );
      if (!bVar4) {
LAB_00678cd9:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar11 = 0;
    }
    freeAndDecommitPages.data[3] = freePages.data[4];
    freeAndDecommitPages.data[1] = freePages.data[2];
    freeAndDecommitPages.data[2] = freePages.data[3];
    auStack_98 = (undefined1  [8])freePages.data[0].word;
    freeAndDecommitPages.data[0] = freePages.data[1];
    BVStatic<272UL>::Or((BVStatic<272UL> *)auStack_98,&decommitPages);
    uVar7 = this->freePageCount;
    BVar9 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_98,0);
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    uVar12 = (ulong)pageCount * 0x1000;
    for (; BVar9 != 0xffffffff;
        BVar9 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_98,BVar9)) {
      pPVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
               allocator;
      pAVar14 = &pPVar2[-1].allocatorType;
      if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
        pAVar14 = (AllocatorType *)0x0;
      }
      if (pAVar14[0x28] <= BVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x1a3,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar4) goto LAB_00678cd9;
        *puVar11 = 0;
      }
      uVar10 = GetAvailablePageCount(this);
      if (uVar10 - BVar9 < pageCount) {
        return (char *)0x0;
      }
      if ((pageCount == 1) ||
         (BVar5 = BVStatic<272UL>::TestRange((BVStatic<272UL> *)auStack_98,BVar9,pageCount),
         BVar5 != '\0')) {
        lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address + (BVar9 << 0xc);
        if ((uVar12 - 1 & (ulong)lpAddress) == 0) {
          pPVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                   allocator;
          this_02 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)&pPVar2[-1].allocatorType;
          if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
            this_02 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)0x0;
          }
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::GetVirtualAllocator(this_02);
          pPVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                   allocator;
          pAVar14 = &pPVar2[-1].allocatorType;
          if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
            pAVar14 = (AllocatorType *)0x0;
          }
          pcVar13 = (char *)VirtualAllocWrapper::AllocPages
                                      ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,
                                       lpAddress,(ulong)pageCount,0x1000,4,pAVar14[0x50] == 2);
          if (pcVar13 == (char *)0x0) {
            if (pageCount == 1) {
              return (char *)0x0;
            }
            goto LAB_00678b77;
          }
          if (pcVar13 != lpAddress) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x1be,"(ret == pages)","ret == pages");
            if (!bVar4) goto LAB_00678cd9;
            *puVar11 = 0;
          }
          BVStatic<272UL>::ClearRange(this_00,BVar9,pageCount);
          BVStatic<272UL>::ClearRange(this_01,BVar9,pageCount);
          BVar9 = BVStatic<272UL>::Count(this_00);
          BVar6 = (this->freePageCount - uVar7) + BVar9;
          this->freePageCount = BVar6;
          this->decommitPageCount = this->decommitPageCount + (uVar7 - (BVar9 + pageCount));
          BVar9 = BVStatic<272UL>::Count(this_00);
          if (BVar6 != BVar9) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x1c7,"(freePageCount == (uint)this->GetCountOfFreePages())",
                               "freePageCount == (uint)this->GetCountOfFreePages()");
            if (!bVar4) goto LAB_00678cd9;
            *puVar11 = 0;
          }
          BVar9 = this->decommitPageCount;
          BVar6 = BVStatic<272UL>::Count(this_01);
          if (BVar9 == BVar6) {
            return lpAddress;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x1c8,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                             "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
          if (bVar4) {
            *puVar11 = 0;
            return lpAddress;
          }
          goto LAB_00678cd9;
        }
        BVar9 = BVar9 + (int)((ulong)lpAddress % uVar12 >> 0xc);
        pPVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator;
        pAVar14 = &pPVar2[-1].allocatorType;
        if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
          pAVar14 = (AllocatorType *)0x0;
        }
        if (pAVar14[0x28] <= BVar9) {
          return (char *)0x0;
        }
      }
      else {
LAB_00678b77:
        BVar9 = BVar9 + 1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<TVirtualAlloc>::AllocDecommitPages(uint pageCount, T freePages, T decommitPages)
{
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    Assert(decommitPageCount ==  (uint)this->GetCountOfDecommitPages());
    Assert(decommitPageCount != 0);
    if (freePageCount + decommitPageCount < pageCount)
    {
        return nullptr;
    }
    Assert(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate());

    T freeAndDecommitPages = freePages;

    freeAndDecommitPages.Or(&decommitPages);

    uint oldFreePageCount = freePageCount;
    uint index = freeAndDecommitPages.GetNextBit(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || freeAndDecommitPages.TestRange(index, pageCount))
        {
            char * pages = this->address + index * AutoSystemInfo::PageSize;

            if (!notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(pages, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = freeAndDecommitPages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            void * ret = this->GetAllocator()->GetVirtualAllocator()->AllocPages(pages, pageCount, MEM_COMMIT, PAGE_READWRITE, this->IsInCustomHeapAllocator());
            if (ret != nullptr)
            {
                Assert(ret == pages);

                this->ClearRangeInFreePagesBitVector(index, pageCount);
                this->ClearRangeInDecommitPagesBitVector(index, pageCount);

                uint newFreePageCount = this->GetCountOfFreePages();
                freePageCount = freePageCount - oldFreePageCount + newFreePageCount;
                decommitPageCount -= pageCount - (oldFreePageCount - newFreePageCount);

                Assert(freePageCount == (uint)this->GetCountOfFreePages());
                Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());

                return pages;
            }
            else if (pageCount == 1)
            {
                // if we failed to commit one page, we should just give up.
                return nullptr;
            }
        }
        index = freeAndDecommitPages.GetNextBit(index + 1);
    }

    return nullptr;
}